

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void * ns_start_thread(_func_void_ptr_void_ptr *f,void *p)

{
  undefined1 local_58 [8];
  pthread_attr_t attr;
  pthread_t thread_id;
  void *p_local;
  _func_void_ptr_void_ptr *f_local;
  
  attr._48_8_ = 0;
  thread_id = (pthread_t)p;
  p_local = f;
  pthread_attr_init((pthread_attr_t *)local_58);
  pthread_attr_setdetachstate((pthread_attr_t *)local_58,1);
  pthread_create((pthread_t *)(attr.__size + 0x30),(pthread_attr_t *)local_58,
                 (__start_routine *)p_local,(void *)thread_id);
  pthread_attr_destroy((pthread_attr_t *)local_58);
  return (void *)attr._48_8_;
}

Assistant:

void *ns_start_thread(void *(*f)(void *), void *p) {
#ifdef _WIN32
  return (void *) _beginthread((void (__cdecl *)(void *)) f, 0, p);
#else
  pthread_t thread_id = (pthread_t) 0;
  pthread_attr_t attr;

  (void) pthread_attr_init(&attr);
  (void) pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_DETACHED);

#if defined(NS_STACK_SIZE) && NS_STACK_SIZE > 1
  (void) pthread_attr_setstacksize(&attr, NS_STACK_SIZE);
#endif

  pthread_create(&thread_id, &attr, f, p);
  pthread_attr_destroy(&attr);

  return (void *) thread_id;
#endif
}